

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disjunctiveMonotone.c
# Opt level: O2

Vec_Int_t * vectorDifference(Vec_Int_t *A,Vec_Int_t *B)

{
  int Entry;
  int iVar1;
  Vec_Int_t *p;
  int i;
  
  p = Vec_IntAlloc(0);
  for (i = 0; i < A->nSize; i = i + 1) {
    Entry = Vec_IntEntry(A,i);
    iVar1 = Vec_IntFind(B,Entry);
    if (iVar1 == -1) {
      Vec_IntPush(p,Entry);
    }
  }
  return p;
}

Assistant:

Vec_Int_t *vectorDifference(Vec_Int_t *A, Vec_Int_t *B)
{
	Vec_Int_t *C;
	int iElem, i;

	C = Vec_IntAlloc(0);
	Vec_IntForEachEntry( A, iElem, i )
	{
		if( Vec_IntFind( B, iElem ) == -1 )
		{
			Vec_IntPush( C, iElem );
		}
	}

	return C;
}